

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

bool __thiscall duckdb::RowGroupCollection::IsEmpty(RowGroupCollection *this)

{
  RowGroupSegmentTree *pRVar1;
  RowGroup *pRVar2;
  SegmentLock l;
  unique_lock<std::mutex> local_20;
  
  pRVar1 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  local_20._M_device = &(pRVar1->super_SegmentTree<duckdb::RowGroup,_true>).node_lock;
  local_20._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  pRVar1 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  pRVar2 = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                     (&pRVar1->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_20);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return pRVar2 == (RowGroup *)0x0;
}

Assistant:

bool RowGroupCollection::IsEmpty() const {
	auto l = row_groups->Lock();
	return IsEmpty(l);
}